

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O0

void __thiscall Imf_3_4::anon_unknown_6::LineBufferTask::execute(LineBufferTask_conflict *this)

{
  long lVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  reference pvVar5;
  char **writePtr_00;
  size_type sVar6;
  reference xSize;
  ulong uVar7;
  long in_RDI;
  exception *e;
  int compSize;
  char *compPtr;
  Compressor *compressor;
  char *endPtr;
  char *readPtr;
  intptr_t linePtr;
  intptr_t base;
  int dMaxX;
  int dMinX;
  OutSliceInfo_conflict *slice;
  uint i;
  char *writePtr;
  int y;
  int dy;
  int yStop;
  int yStart;
  undefined8 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  Array<Imf_3_4::Array<char>_> *in_stack_ffffffffffffff88;
  Data *ofd;
  char *endPtr_00;
  char **in_stack_ffffffffffffffb8;
  char **in_stack_ffffffffffffffc0;
  PixelType in_stack_ffffffffffffffd8;
  Format format;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  
  if (*(int *)(*(long *)(in_RDI + 0x10) + 0x80) == 0) {
    local_c = *(int *)(*(long *)(in_RDI + 0x18) + 0x30);
    local_10 = *(int *)(*(long *)(in_RDI + 0x18) + 0x34) + 1;
    local_14 = 1;
  }
  else {
    local_c = *(int *)(*(long *)(in_RDI + 0x18) + 0x34);
    local_10 = *(int *)(*(long *)(in_RDI + 0x18) + 0x30) + -1;
    local_14 = -1;
  }
  for (local_18 = local_c; local_18 != local_10; local_18 = local_14 + local_18) {
    pcVar4 = Array::operator_cast_to_char_(*(Array **)(in_RDI + 0x18));
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        (*(long *)(in_RDI + 0x10) + 200),
                        (long)(local_18 - *(int *)(*(long *)(in_RDI + 0x10) + 0x8c)));
    writePtr_00 = (char **)(pcVar4 + *pvVar5);
    for (format = NATIVE; uVar7 = (ulong)format,
        sVar6 = std::
                vector<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
                ::size((vector<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
                        *)(*(long *)(in_RDI + 0x10) + 0xe8)), uVar7 < sVar6; format = format + XDR)
    {
      xSize = std::
              vector<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
              ::operator[]((vector<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
                            *)(*(long *)(in_RDI + 0x10) + 0xe8),(ulong)format);
      iVar2 = Imath_3_2::modp((int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                              (int)in_stack_ffffffffffffff50);
      if (iVar2 == 0) {
        iVar2 = Imath_3_2::divp(*(int *)(*(long *)(in_RDI + 0x10) + 0x84),xSize->xSampling);
        Imath_3_2::divp(*(int *)(*(long *)(in_RDI + 0x10) + 0x88),xSize->xSampling);
        if ((xSize->zero & 1U) == 0) {
          pcVar4 = xSize->base;
          endPtr_00 = pcVar4;
          iVar3 = Imath_3_2::divp(local_18,xSize->ySampling);
          pcVar4 = pcVar4 + (long)iVar3 * xSize->yStride;
          copyFromFrameBuffer(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,endPtr_00,
                              (size_t)pcVar4,
                              (Format)((ulong)(pcVar4 + (long)iVar2 * xSize->xStride) >> 0x20),
                              (PixelType)(pcVar4 + (long)iVar2 * xSize->xStride));
        }
        else {
          fillChannelWithZeroes(writePtr_00,format,in_stack_ffffffffffffffd8,(size_t)xSize);
        }
      }
    }
    if (*(char ***)(*(long *)(in_RDI + 0x18) + 0x20) < writePtr_00) {
      *(char ***)(*(long *)(in_RDI + 0x18) + 0x20) = writePtr_00;
    }
  }
  if ((local_18 < *(int *)(*(long *)(in_RDI + 0x18) + 0x28)) ||
     (*(int *)(*(long *)(in_RDI + 0x18) + 0x2c) < local_18)) {
    pcVar4 = Array::operator_cast_to_char_(*(Array **)(in_RDI + 0x18));
    *(char **)(*(long *)(in_RDI + 0x18) + 0x10) = pcVar4;
    iVar2 = (int)*(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x20);
    pcVar4 = Array::operator_cast_to_char_(*(Array **)(in_RDI + 0x18));
    *(int *)(*(long *)(in_RDI + 0x18) + 0x18) = iVar2 - (int)pcVar4;
    ofd = *(Data **)(*(long *)(in_RDI + 0x18) + 0x38);
    if (ofd != (Data *)0x0) {
      lVar1 = *(long *)(in_RDI + 0x18);
      iVar2 = (**(code **)(*(long *)&(ofd->header)._map._M_t._M_impl + 0x20))
                        (ofd,*(undefined8 *)(lVar1 + 0x10),*(undefined4 *)(lVar1 + 0x18),
                         *(undefined4 *)(lVar1 + 0x28),&stack0xffffffffffffff88);
      if (iVar2 < *(int *)(*(long *)(in_RDI + 0x18) + 0x18)) {
        *(int *)(*(long *)(in_RDI + 0x18) + 0x18) = iVar2;
        *(Array<Imf_3_4::Array<char>_> **)(*(long *)(in_RDI + 0x18) + 0x10) =
             in_stack_ffffffffffffff88;
      }
      else if (*(int *)(*(long *)(in_RDI + 0x10) + 0xe0) == 0) {
        convertToXdr(ofd,in_stack_ffffffffffffff88,iVar2,in_stack_ffffffffffffff80,
                     in_stack_ffffffffffffff7c);
      }
    }
    *(undefined1 *)(*(long *)(in_RDI + 0x18) + 0x40) = 0;
  }
  return;
}

Assistant:

void
LineBufferTask::execute ()
{
    try
    {
        //
        // First copy the pixel data from the
        // frame buffer into the line buffer
        //

        int yStart, yStop, dy;

        if (_ofd->lineOrder == INCREASING_Y)
        {
            yStart = _lineBuffer->scanLineMin;
            yStop  = _lineBuffer->scanLineMax + 1;
            dy     = 1;
        }
        else
        {
            yStart = _lineBuffer->scanLineMax;
            yStop  = _lineBuffer->scanLineMin - 1;
            dy     = -1;
        }

        //
        // Allocate buffers for scanlines.
        // And calculate the sample counts for each line.
        //

        bytesPerDeepLineTable (
            _ofd->header,
            _lineBuffer->scanLineMin,
            _lineBuffer->scanLineMax,
            _ofd->sampleCountSliceBase,
            _ofd->sampleCountXStride,
            _ofd->sampleCountYStride,
            _ofd->bytesPerLine);
        for (int i = _lineBuffer->scanLineMin; i <= _lineBuffer->scanLineMax;
             i++)
        {
            // (TODO) don't do this all the time.
            _lineBuffer->buffer[i - _lineBuffer->minY].resizeErase (
                static_cast<long> (_ofd->bytesPerLine[i - _ofd->minY]));

            for (int j = _ofd->minX; j <= _ofd->maxX; j++)
                _ofd->lineSampleCount[i - _ofd->minY] +=
                    _ofd->getSampleCount (j, i);
        }

        //
        // Copy data from frame buffer to line buffer.
        //

        int y;

        for (y = yStart; y != yStop; y += dy)
        {
            //
            // Gather one scan line's worth of pixel data and store
            // them in _ofd->lineBuffer.
            //

            char* writePtr = &_lineBuffer->buffer[y - _lineBuffer->minY][0];
            //
            // Iterate over all image channels.
            //

            for (unsigned int i = 0; i < _ofd->slices.size (); ++i)
            {
                //
                // Test if scan line y of this channel contains any data
                // (the scan line contains data only if y % ySampling == 0).
                //

                const OutSliceInfo& slice = *_ofd->slices[i];

                if (modp (y, slice.ySampling) != 0) continue;

                //
                // Fill the line buffer with with pixel data.
                //

                if (slice.zero)
                {
                    //
                    // The frame buffer contains no data for this channel.
                    // Store zeroes in _lineBuffer->buffer.
                    //

                    fillChannelWithZeroes (
                        writePtr,
                        _ofd->format,
                        slice.type,
                        _ofd->lineSampleCount[y - _ofd->minY]);
                }
                else
                {

                    copyFromDeepFrameBuffer (
                        writePtr,
                        slice.base,
                        _ofd->sampleCountSliceBase,
                        _ofd->sampleCountXStride,
                        _ofd->sampleCountYStride,
                        y,
                        _ofd->minX,
                        _ofd->maxX,
                        0,
                        0, //offsets for samplecount
                        0,
                        0, //offsets for data
                        slice.sampleStride,
                        slice.xStride,
                        slice.yStride,
                        _ofd->format,
                        slice.type);
                }
            }
        }

        //
        // If the next scanline isn't past the bounds of the lineBuffer
        // then we have partially filled the linebuffer,
        // otherwise the whole linebuffer is filled and then
        // we compress the linebuffer and write it out.
        //

        if (y >= _lineBuffer->minY && y <= _lineBuffer->maxY) return;

        //
        // Copy all data into a consecutive buffer.
        //

        uint64_t totalBytes      = 0;
        uint64_t maxBytesPerLine = 0;
        for (int i = 0; i < _lineBuffer->maxY - _lineBuffer->minY + 1; i++)
        {
            totalBytes += _lineBuffer->buffer[i].size ();
            if (uint64_t (_lineBuffer->buffer[i].size ()) > maxBytesPerLine)
                maxBytesPerLine = _lineBuffer->buffer[i].size ();
        }
        _lineBuffer->consecutiveBuffer.resizeErase (
            static_cast<long> (totalBytes));

        int pos = 0;
        for (int i = 0; i < _lineBuffer->maxY - _lineBuffer->minY + 1; i++)
        {
            memcpy (
                _lineBuffer->consecutiveBuffer + pos,
                &_lineBuffer->buffer[i][0],
                _lineBuffer->buffer[i].size ());
            pos += _lineBuffer->buffer[i].size ();
        }

        _lineBuffer->dataPtr = _lineBuffer->consecutiveBuffer;

        _lineBuffer->dataSize             = totalBytes;
        _lineBuffer->uncompressedDataSize = _lineBuffer->dataSize;

        //
        // Compress the pixel sample count table.
        //

        char*    ptr           = _lineBuffer->sampleCountTableBuffer;
        uint64_t tableDataSize = 0;
        for (int i = _lineBuffer->minY; i <= _lineBuffer->maxY; i++)
        {
            int count = 0;
            for (int j = _ofd->minX; j <= _ofd->maxX; j++)
            {
                count += _ofd->getSampleCount (j, i);
                Xdr::write<CharPtrIO> (ptr, count);
                tableDataSize += sizeof (int);
            }
        }

        if (_lineBuffer->sampleCountTableCompressor)
        {
            _lineBuffer->sampleCountTableSize =
                _lineBuffer->sampleCountTableCompressor->compress (
                    _lineBuffer->sampleCountTableBuffer,
                    static_cast<int> (tableDataSize),
                    _lineBuffer->minY,
                    _lineBuffer->sampleCountTablePtr);
        }

        //
        // If we can't make data shrink (or we weren't compressing), then just use the raw data.
        //

        if (!_lineBuffer->sampleCountTableCompressor ||
            _lineBuffer->sampleCountTableSize >= tableDataSize)
        {
            _lineBuffer->sampleCountTableSize = tableDataSize;
            _lineBuffer->sampleCountTablePtr =
                _lineBuffer->sampleCountTableBuffer;
        }

        //
        // Compress the sample data
        //

        // (TODO) don't do this all the time.
        if (_lineBuffer->compressor != 0) delete _lineBuffer->compressor;
        _lineBuffer->compressor = newCompressor (
            _ofd->header.compression (), maxBytesPerLine, _ofd->header);

        Compressor* compressor = _lineBuffer->compressor;

        if (compressor)
        {
            const char* compPtr;

            uint64_t compSize = compressor->compress (
                _lineBuffer->dataPtr,
                static_cast<int> (_lineBuffer->dataSize),
                _lineBuffer->minY,
                compPtr);

            if (compSize < _lineBuffer->dataSize)
            {
                _lineBuffer->dataSize = compSize;
                _lineBuffer->dataPtr  = compPtr;
            }
            else if (_ofd->format == Compressor::NATIVE)
            {
                //
                // The data did not shrink during compression, but
                // we cannot write to the file using the machine's
                // native format, so we need to convert the lineBuffer
                // to Xdr.
                //

                convertToXdr (
                    _ofd,
                    _lineBuffer->consecutiveBuffer,
                    _lineBuffer->minY,
                    _lineBuffer->maxY,
                    static_cast<int> (_lineBuffer->dataSize));
            }
        }

        _lineBuffer->partiallyFull = false;
    }
    catch (std::exception& e)
    {
        if (!_lineBuffer->hasException)
        {
            _lineBuffer->exception    = e.what ();
            _lineBuffer->hasException = true;
        }
    }
    catch (...)
    {
        if (!_lineBuffer->hasException)
        {
            _lineBuffer->exception    = "unrecognized exception";
            _lineBuffer->hasException = true;
        }
    }
}